

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O2

void valid_option(int argc,char **argv,char *in_path,char *out_path,int *n1,int *n2,int *level,
                 int *h_type,int *histo,int *sm,int *sp,int *sf,int *pyr,int *ssd,int *f_type,
                 float *trsh,char *i_fname,char *v_fname,char *c_fname,char *h_fname,int *nbin,
                 float *incr,int *iter,int *binary,int *row,int *col)

{
  byte bVar1;
  byte *__s2;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  string ext;
  string str_trsh;
  string t0;
  
  if (argc == 1) {
    usage();
  }
  else {
    if (0x14 < argc - 4U) {
LAB_00103dba:
      iVar7 = 1;
      goto LAB_00103dbc;
    }
    *binary = 0;
    *sm = 1;
    *sp = 1;
    *sf = 0;
    *pyr = 2;
    *level = 1;
    *histo = 0;
    *ssd = 3;
    *trsh = 0.0;
    *nbin = 0;
    *iter = 10;
    builtin_strncpy(i_fname,"Undefined",10);
    builtin_strncpy(v_fname,"Undefined",10);
    builtin_strncpy(c_fname,"Undefined",10);
    builtin_strncpy(h_fname,"Undefined",10);
    bVar2 = false;
    uVar8 = 4;
    while (iVar7 = (int)uVar8, iVar7 < argc) {
      __s2 = (byte *)argv[uVar8];
      iVar3 = strcmp("-NR",(char *)__s2);
      piVar5 = sm;
      if (iVar3 == 0) {
LAB_001038a2:
        *piVar5 = 0;
        iVar3 = 1;
      }
      else {
        bVar1 = *__s2;
        iVar4 = -(bVar1 - 0x2d);
        iVar3 = iVar4;
        if (bVar1 == 0x2d) {
          uVar6 = __s2[1] - 0x46;
          if (uVar6 == 0) {
            uVar6 = (uint)__s2[2];
          }
          if (uVar6 != 0) {
            uVar6 = __s2[1] - 0x43;
            if (uVar6 == 0) {
              uVar6 = (uint)__s2[2];
            }
            iVar3 = -uVar6;
            goto LAB_00103771;
          }
          uVar6 = iVar7 + 1;
          if (argc <= (int)uVar6) goto LAB_00103dba;
          __isoc99_sscanf(argv[uVar6],"%f",trsh);
          strcpy(str_trsh,argv[uVar6]);
          if (*sf == 1) {
            iVar7 = 3;
            goto LAB_00103dbc;
          }
          *sf = 1;
          *f_type = 0;
        }
        else {
LAB_00103771:
          if (iVar3 == 0) {
            if ((int)(iVar7 + 3U) < argc) {
              strcpy(c_fname,argv[uVar8 + 1]);
              __isoc99_sscanf(argv[uVar8 + 2],"%d",nbin);
              __isoc99_sscanf(argv[iVar7 + 3U],"%f",incr);
              *h_type = 0;
              *histo = 1;
              iVar3 = 4;
              goto LAB_001039ff;
            }
            goto LAB_00103dba;
          }
          iVar3 = iVar4;
          if (bVar1 == 0x2d) {
            uVar6 = __s2[1] - 0x50;
            if (uVar6 == 0) {
              uVar6 = (uint)__s2[2];
            }
            piVar5 = sp;
            if (uVar6 == 0) goto LAB_001038a2;
            uVar6 = __s2[1] - 0x4c;
            if (uVar6 == 0) {
              uVar6 = (uint)__s2[2];
            }
            iVar3 = -uVar6;
          }
          if (iVar3 == 0) {
            if (argc <= (int)(iVar7 + 1U)) goto LAB_00103dba;
            pcVar9 = argv[iVar7 + 1U];
            piVar5 = level;
          }
          else {
            iVar3 = iVar4;
            if (bVar1 == 0x2d) {
              uVar6 = __s2[1] - 0x49;
              if (uVar6 == 0) {
                uVar6 = (uint)__s2[2];
              }
              if (uVar6 == 0) {
                if ((int)(iVar7 + 1U) < argc) {
                  pcVar9 = argv[iVar7 + 1U];
                  piVar5 = iter;
                  goto LAB_001039f5;
                }
                goto LAB_00103dba;
              }
              uVar6 = __s2[1] - 0x57;
              if (uVar6 == 0) {
                uVar6 = (uint)__s2[2];
              }
              iVar3 = -uVar6;
            }
            if (iVar3 != 0) {
              if (bVar1 == 0x2d) {
                uVar6 = __s2[1] - 0x4e;
                if (uVar6 == 0) {
                  uVar6 = (uint)__s2[2];
                }
                if (uVar6 == 0) {
                  if ((int)(iVar7 + 2U) < argc) {
                    __isoc99_sscanf(argv[uVar8 + 1],"%d",n1);
                    __isoc99_sscanf(argv[iVar7 + 2U],"%d",n2);
                    iVar3 = 3;
                    bVar2 = true;
                    goto LAB_001039ff;
                  }
                  goto LAB_00103dba;
                }
                uVar6 = __s2[1] - 0x42;
                if (uVar6 == 0) {
                  uVar6 = (uint)__s2[2];
                }
                iVar4 = -uVar6;
              }
              if (iVar4 == 0) {
                if ((int)(iVar7 + 2U) < argc) {
                  __isoc99_sscanf(argv[uVar8 + 1],"%d",col);
                  __isoc99_sscanf(argv[iVar7 + 2U],"%d",row);
                  *binary = 1;
                  iVar3 = 3;
                  goto LAB_001039ff;
                }
                goto LAB_00103dba;
              }
              iVar7 = 2;
              goto LAB_00103dbc;
            }
            if (argc <= (int)(iVar7 + 1U)) goto LAB_00103dba;
            pcVar9 = argv[iVar7 + 1U];
            piVar5 = ssd;
          }
LAB_001039f5:
          __isoc99_sscanf(pcVar9,"%d",piVar5);
        }
        iVar3 = 2;
      }
LAB_001039ff:
      uVar8 = (ulong)(uint)(iVar7 + iVar3);
    }
    if (*nbin < 0x65) {
      if (*level < 5) {
        if (((uint)*ssd < 8) && ((0xa8U >> (*ssd & 0x1fU) & 1) != 0)) {
          if (bVar2) {
            if (*n1 != *n2) {
              concat(argv[1],"/",in_path);
              concat(argv[2],"/",out_path);
              concat(in_path,argv[3],i_fname);
              ext[2] = '\0';
              ext[0] = '-';
              ext[1] = 'n';
              sprintf(t0,"%d",(ulong)(uint)*n1);
              concat(ext,t0,ext);
              concat(ext,"-",ext);
              sprintf(t0,"%d",(ulong)(uint)*n2);
              concat(ext,t0,ext);
              concat(ext,"-w",ext);
              sprintf(t0,"%d",(ulong)(uint)*ssd);
              concat(ext,t0,ext);
              concat(ext,"-l",ext);
              sprintf(t0,"%d",(ulong)(uint)*level);
              concat(ext,t0,ext);
              concat(ext,"-i",ext);
              sprintf(t0,"%d",(ulong)(uint)*iter);
              concat(ext,t0,ext);
              if (*sm == 0) {
                concat(ext,"-r",ext);
              }
              if (*sp == 0) {
                concat(ext,"-s",ext);
              }
              if (*sf != 0) {
                concat(ext,"-f",ext);
                concat(ext,str_trsh,ext);
              }
              concat(out_path,*argv,v_fname);
              concat(v_fname,".",v_fname);
              concat(v_fname,argv[3],v_fname);
              concat(v_fname,"F",v_fname);
              concat(v_fname,ext,v_fname);
              if (*histo != 0) {
                concat(out_path,*argv,h_fname);
                concat(h_fname,".",h_fname);
                concat(h_fname,argv[3],h_fname);
                concat(h_fname,"H",h_fname);
                concat(h_fname,ext,h_fname);
              }
              printf(" Generated velocity filename  : %s\n",v_fname);
              printf(" Generated histogram filename : %s\n",h_fname);
              printf(" Input stem name              : %s\n",i_fname);
              printf(" Correct velocity filename    : %s\n",c_fname);
              fflush(_stdout);
              return;
            }
            iVar7 = 0x12;
          }
          else {
            iVar7 = 0x11;
          }
        }
        else {
          iVar7 = 0x10;
        }
      }
      else {
        iVar7 = 4;
      }
      goto LAB_00103dbc;
    }
  }
  iVar7 = 0xd;
LAB_00103dbc:
  error(iVar7);
}

Assistant:

void valid_option(argc,argv,in_path,out_path,n1,n2,level,h_type,histo,sm,sp,sf,pyr,
ssd,f_type,trsh,i_fname,v_fname,c_fname,h_fname,nbin,incr,iter,binary,row,col)
char *argv[] ;
int argc, *n1, *n2, *iter, *level, *h_type, *histo, *sm, *sp, *sf, *pyr,
    *f_type, *nbin, *ssd, *binary, *row, *col ;
float *trsh, *incr ;
string in_path, out_path, i_fname, v_fname, c_fname, h_fname ;

{ string ext, t0, str_trsh ;
  int i, fn ;

  if (argc == 1) {
    usage() ;
  }
  if ((argc <= 24) && (argc >= 4)) {
    *binary = FALSE ;
    *sm = TRUE ;
    *sp = TRUE ;
    *sf = FALSE ;
    *pyr = LAP ;
    *level = DEFLEVEL ;
    *histo = FALSE ;
    fn = FALSE ;
    *ssd = 3 ;
    *trsh = 0.0 ;
    *nbin = 0 ;
    *iter = RELAXITER ;
    strcpy(i_fname,"Undefined") ;
    strcpy(v_fname,"Undefined") ;
    strcpy(c_fname,"Undefined") ;
    strcpy(h_fname,"Undefined") ;
  }
  else {
    error(1) ;
  }
  i = 4 ;
  while (i < argc) {
    if (strcmp("-NR",argv[i]) == 0) {
      *sm = FALSE ;
      i += 1 ;
    }
    else {
      if (strcmp("-F",argv[i]) == 0) {
        if (i + 1 < argc) {
          sscanf(argv[i+1],"%f",trsh) ;
          strcpy(str_trsh,argv[i+1]) ;
          if (*sf == TRUE) {
            error(3) ;
          }
          *sf = TRUE ;
          *f_type = CMIN ;
          i += 2 ;
        }
        else {
          error(1) ;
        }
      }
      else {
        if (strcmp("-C",argv[i]) == 0) {
          if (i + 3 < argc) {
            strcpy(c_fname,argv[i+1]) ;
            sscanf(argv[i+2],"%d",nbin) ;
            sscanf(argv[i+3],"%f",incr) ;
            *h_type = CMIN ;
            *histo = TRUE ;
            i += 4 ;
          }
          else {
            error(1) ;
          }
        }
        else {
          if (strcmp("-P",argv[i]) == 0) {
            *sp = FALSE ;
            i += 1 ;
          }
          else {
            if (strcmp("-L",argv[i]) == 0) {
              if ( i + 1 < argc) {
                sscanf(argv[i+1],"%d",level) ;
                i += 2 ;
              }
              else {
                error(1) ;
              }
            }
            else {
              if (strcmp("-I",argv[i]) == 0) {
                if (i + 1 < argc) {
                  sscanf(argv[i+1],"%d",iter) ;
                  i += 2 ;
                }
                else {
                  error(1) ;
                }
              }
              else {
                if (strcmp("-W",argv[i]) == 0) {
                  if (i + 1 < argc) {
                    sscanf(argv[i+1],"%d",ssd) ;
                    i += 2 ;
                  }
                  else {
                    error(1) ;
                  }
                }
                else {
                  if (strcmp("-N",argv[i]) == 0) {
                    if (i + 2 < argc) {
                      sscanf(argv[i+1],"%d",n1) ;
                      sscanf(argv[i+2],"%d",n2) ;
                      fn = TRUE ;
                      i += 3 ;
                    }
                    else {
                      error(1) ;
                    }
                  }
                  else {
                    if (strcmp("-B",argv[i]) == 0) {
                      if (i + 2 < argc) {
                        sscanf(argv[i+1],"%d",col) ;
                        sscanf(argv[i+2],"%d",row) ;
                        *binary = TRUE ;
                        i += 3 ;
                      }
                      else {
                        error(1) ;
                      }
                    }
                    else {
                      error(2) ;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*nbin > N_BINS) {
    error(13) ;
  }
  if (*level > MAXLEVEL) {
    error(4) ;
  }
  if (*ssd != 3 && *ssd != 5 && *ssd != 7) {
    error(16) ;
  }
  if (!fn) {
    error(17) ;
  }
  if (*n1 == *n2) {
    error(18) ;
  }
  concat(argv[1],"/",in_path) ;
  concat(argv[2],"/",out_path) ;

  concat(in_path,argv[3],i_fname) ;

  strcpy(ext,"-n") ;
  sprintf(t0,"%d",*n1);
  concat(ext,t0,ext) ;
  concat(ext,"-",ext) ;
  sprintf(t0,"%d",*n2);
  concat(ext,t0,ext) ;
  concat(ext,"-w",ext) ;
  sprintf(t0,"%d",*ssd);
  concat(ext,t0,ext) ;
  concat(ext,"-l",ext) ;
  sprintf(t0,"%d",*level);
  concat(ext,t0,ext) ;
  concat(ext,"-i",ext) ;
  sprintf(t0,"%d",*iter);
  concat(ext,t0,ext) ;
  if (!(*sm)) {
    concat(ext,"-r",ext) ;
  }
  if (!(*sp)) {
    concat(ext,"-s",ext) ;
  }
  if (*sf) {
    concat(ext,"-f",ext) ;
    concat(ext,str_trsh,ext) ;
  }
  concat(out_path,argv[0],v_fname) ;
  concat(v_fname,".",v_fname) ;
  concat(v_fname,argv[3],v_fname) ;
  concat(v_fname,"F",v_fname) ;
  concat(v_fname,ext,v_fname) ;
  if (*histo) {
    concat(out_path,argv[0],h_fname) ;
    concat(h_fname,".",h_fname) ;
    concat(h_fname,argv[3],h_fname) ;
    concat(h_fname,"H",h_fname) ;
    concat(h_fname,ext,h_fname) ;
  }
  printf(" Generated velocity filename  : %s\n",v_fname) ;
  printf(" Generated histogram filename : %s\n",h_fname) ;
  printf(" Input stem name              : %s\n",i_fname) ;
  printf(" Correct velocity filename    : %s\n",c_fname) ;
  fflush(stdout) ;
}